

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  bool bVar1;
  App *this_00;
  undefined8 uVar2;
  byte *in_RDX;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000040;
  App *in_stack_00000048;
  Classifier classifier;
  bool retval;
  App *in_stack_000000b8;
  bool in_stack_0000015f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000160;
  App *in_stack_00000168;
  undefined1 in_stack_0000081e;
  Classifier in_stack_0000081f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000820;
  App *in_stack_00000828;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff70;
  Classifier CVar3;
  Classifier val_type;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffb8;
  HorribleError *in_stack_ffffffffffffffc0;
  bool local_19;
  
  local_19 = true;
  if ((*in_RDX & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back(in_stack_ffffffffffffff50);
    CVar3 = _recognize(in_stack_000000b8,(string *)this,args._7_1_);
  }
  else {
    CVar3 = NONE;
  }
  this_00 = (App *)(ulong)CVar3;
  switch(this_00) {
  case (App *)0x0:
    local_19 = _parse_positional(in_stack_00000168,in_stack_00000160,in_stack_0000015f);
    if ((local_19) && ((*(byte *)(in_RDI + 0x2dd) & 1) != 0)) {
      *in_RDX = 1;
    }
    break;
  case (App *)0x1:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x155800);
    *in_RDX = 1;
    bVar1 = _has_remaining_positionals(this_00);
    if ((bVar1) || (*(long *)(in_RDI + 0x308) == 0)) {
      ::std::allocator<char>::allocator();
      val_type = (Classifier)((ulong)in_RDI >> 0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
      _move_to_missing((App *)CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)
                                      ),val_type,(string *)CONCAT17(CVar3,in_stack_ffffffffffffff70)
                      );
      ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    }
    else {
      local_19 = false;
    }
    break;
  case (App *)0x2:
  case (App *)0x3:
  case (App *)0x4:
    local_19 = _parse_arg(in_stack_00000828,in_stack_00000820,in_stack_0000081f,
                          (bool)in_stack_0000081e);
    break;
  case (App *)0x5:
    local_19 = _parse_subcommand(in_stack_00000048,in_stack_00000040);
    break;
  case (App *)0x6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1558de);
    local_19 = false;
    break;
  default:
    uVar4 = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff87,CONCAT16(uVar4,in_stack_ffffffffffffff80)));
    HorribleError::HorribleError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&HorribleError::typeinfo,HorribleError::~HorribleError);
  }
  return local_19;
}

Assistant:

CLI11_INLINE bool App::_parse_single(std::vector<std::string> &args, bool &positional_only) {
    bool retval = true;
    detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
    switch(classifier) {
    case detail::Classifier::POSITIONAL_MARK:
        args.pop_back();
        positional_only = true;
        if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
            retval = false;
        } else {
            _move_to_missing(classifier, "--");
        }
        break;
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
        // treat this like a positional mark if in the parent app
        args.pop_back();
        retval = false;
        break;
    case detail::Classifier::SUBCOMMAND:
        retval = _parse_subcommand(args);
        break;
    case detail::Classifier::LONG:
    case detail::Classifier::SHORT:
    case detail::Classifier::WINDOWS_STYLE:
        // If already parsed a subcommand, don't accept options_
        retval = _parse_arg(args, classifier, false);
        break;
    case detail::Classifier::NONE:
        // Probably a positional or something for a parent (sub)command
        retval = _parse_positional(args, false);
        if(retval && positionals_at_end_) {
            positional_only = true;
        }
        break;
        // LCOV_EXCL_START
    default:
        throw HorribleError("unrecognized classifier (you should not see this!)");
        // LCOV_EXCL_STOP
    }
    return retval;
}